

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O3

shared_ptr<Jupiter::IRC::Client::Channel::User> __thiscall
Jupiter::IRC::Client::Channel::getUser(Channel *this,string_view in_nickname)

{
  size_type sVar1;
  const_iterator cVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Jupiter::IRC::Client::Channel::User> sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_len = (size_t)in_nickname._M_str;
  cVar2 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::Channel::User>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::Channel::User>>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::Channel::User>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::Channel::User>>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(in_nickname._M_len + 0x30),&local_18);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    (this->m_name)._M_dataplus._M_p = (pointer)0x0;
    (this->m_name)._M_string_length = 0;
  }
  else {
    (this->m_name)._M_dataplus._M_p =
         *(pointer *)
          ((long)cVar2.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_false>
                 ._M_cur + 0x28);
    sVar1 = *(size_type *)
             ((long)cVar2.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_false>
                    ._M_cur + 0x30);
    (this->m_name)._M_string_length = sVar1;
    if (sVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
      }
    }
  }
  sVar3.super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Jupiter::IRC::Client::Channel::User>)
         sVar3.super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Jupiter::IRC::Client::Channel::User> Jupiter::IRC::Client::Channel::getUser(std::string_view in_nickname) const {
	auto user = m_users.find(JUPITER_WRAP_MAP_KEY(in_nickname));
	if (user != m_users.end()) {
		return user->second;
	}

	return nullptr;
}